

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O1

bool __thiscall FMultiBlockThingsIterator::Next(FMultiBlockThingsIterator *this,CheckResult *item)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  FPortalGroupArray *pFVar4;
  int iVar5;
  AActor *pAVar6;
  WORD *pWVar7;
  ushort uVar8;
  short sVar9;
  uint uVar10;
  ushort uVar11;
  double dVar12;
  double dVar13;
  
  while( true ) {
    pAVar6 = FBlockThingsIterator::Next(&this->blockIterator,false);
    if (pAVar6 != (AActor *)0x0) {
      item->thing = pAVar6;
      iVar5 = pAVar6->Sector->PortalGroup;
      dVar12 = 0.0;
      dVar13 = 0.0;
      if (iVar5 != this->basegroup) {
        iVar5 = iVar5 * Displacements.size + (int)this->basegroup;
        dVar12 = Displacements.data.Array[iVar5].pos.X;
        dVar13 = Displacements.data.Array[iVar5].pos.Y;
      }
      dVar2 = (this->checkpoint).X;
      dVar3 = (this->checkpoint).Y;
      (item->Position).Z = (this->checkpoint).Z;
      (item->Position).Y = dVar13 + dVar3;
      (item->Position).X = dVar12 + dVar2;
      item->portalflags = (int)this->portalflags;
      return true;
    }
    uVar1 = (int)this->index + 1;
    pFVar4 = this->checklist;
    uVar10 = (uint)pFVar4->varused + (pFVar4->data).Count;
    if (uVar1 < uVar10) {
      pWVar7 = pFVar4->entry + uVar1;
      if (3 < uVar1) {
        pWVar7 = (pFVar4->data).Array + ((int)this->index - 3);
      }
      uVar11 = *pWVar7 & 0xc000;
    }
    else {
      uVar11 = 0;
    }
    if (uVar10 <= uVar1) break;
    uVar8 = (ushort)uVar1;
    this->index = uVar8;
    pWVar7 = pFVar4->entry + (uint)(int)(short)uVar8;
    if (3 < uVar8) {
      pWVar7 = (pFVar4->data).Array + ((int)(short)uVar8 - 4);
    }
    startIteratorForGroup(this,*pWVar7 & 0x3fff);
    sVar9 = (ushort)(uVar11 == 0x4000) << 6;
    if (uVar11 == 0x8000) {
      sVar9 = 0x20;
    }
    this->portalflags = sVar9;
  }
  return false;
}

Assistant:

bool FMultiBlockThingsIterator::Next(FMultiBlockThingsIterator::CheckResult *item)
{
	AActor *thing = blockIterator.Next();
	if (thing != NULL)
	{
		item->thing = thing;
		item->Position = checkpoint + Displacements.getOffset(basegroup, thing->Sector->PortalGroup);
		item->portalflags = portalflags;
		return true;
	}
	bool onlast = unsigned(index + 1) >= checklist.Size();
	int nextflags = onlast ? 0 : checklist[index + 1] & FPortalGroupArray::FLAT;

	if (onlast)
	{
		return false;
	}

	index++;
	startIteratorForGroup(checklist[index] & ~FPortalGroupArray::FLAT);
	switch (nextflags)
	{
	case FPortalGroupArray::UPPER:
		portalflags = FFCF_NOFLOOR;
		break;

	case FPortalGroupArray::LOWER:
		portalflags = FFCF_NOCEILING;
		break;

	default:
		portalflags = 0;
	}

	return Next(item);
}